

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

void ps_table_done(PS_Table table)

{
  FT_Byte *old_base;
  FT_Memory memory;
  FT_Byte *__dest;
  int local_2c;
  
  old_base = table->block;
  if (old_base != (FT_Byte *)0x0) {
    memory = table->memory;
    __dest = (FT_Byte *)ft_mem_alloc(memory,table->cursor,&local_2c);
    table->block = __dest;
    if (local_2c == 0) {
      memcpy(__dest,old_base,table->cursor);
      shift_elements(table,old_base);
      table->capacity = table->cursor;
      ft_mem_free(memory,old_base);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_table_done( PS_Table  table )
  {
    FT_Memory  memory = table->memory;
    FT_Error   error;
    FT_Byte*   old_base = table->block;


    /* should never fail, because rec.cursor <= rec.size */
    if ( !old_base )
      return;

    if ( FT_ALLOC( table->block, table->cursor ) )
      return;
    FT_MEM_COPY( table->block, old_base, table->cursor );
    shift_elements( table, old_base );

    table->capacity = table->cursor;
    FT_FREE( old_base );

    FT_UNUSED( error );
  }